

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  bool bVar1;
  Offset<flatbuffers::Table> *local_40;
  Offset<flatbuffers::Table> *r;
  Offset<flatbuffers::Table> *l;
  _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper_local;
  size_t width_local;
  Offset<flatbuffers::Table> *end_local;
  Offset<flatbuffers::Table> *begin_local;
  anon_class_8_1_ba1d59bf comparator_local;
  
  if ((long)width < (long)end - (long)begin >> 2) {
    r = begin + width;
    local_40 = end;
    begin_local = (Offset<flatbuffers::Table> *)comparator.key;
    while (r < local_40) {
      bVar1 = Parser::ParseVector::anon_class_8_1_ba1d59bf::operator()
                        ((anon_class_8_1_ba1d59bf *)&begin_local,begin,r);
      if (bVar1) {
        local_40 = local_40 + -width;
        (*swapper)(r,local_40);
      }
      else {
        r = r + width;
      }
    }
    (*swapper)(begin,r + -width);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,r + -width,width,(anon_class_8_1_ba1d59bf)begin_local,swapper);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (local_40,end,width,(anon_class_8_1_ba1d59bf)begin_local,swapper);
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}